

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_symbol(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  char **ppcVar6;
  bson_t *bcon;
  char *val;
  
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("symbol");
  uVar3 = bcon_new(0,"foo",uVar3,0xd,pcVar4);
  uVar5 = bson_bcone_magic();
  ppcVar6 = bcon_ensure_const_char_ptr_ptr((char **)&bcon);
  bVar1 = bcon_extract(uVar3,"foo",uVar5,0xd,ppcVar6,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xc9,"test_symbol","BCON_EXTRACT (bcon, \"foo\", BCONE_SYMBOL (val))");
    abort();
  }
  iVar2 = strcmp((char *)bcon,"symbol");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xcb,"test_symbol","strcmp (val, \"symbol\") == 0");
    abort();
  }
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_symbol (void)
{
   const char *val;

   bson_t *bcon = BCON_NEW ("foo", BCON_SYMBOL ("symbol"));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_SYMBOL (val)));

   BSON_ASSERT (strcmp (val, "symbol") == 0);

   bson_destroy (bcon);
}